

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O3

size_t __thiscall
CCharmapToLocalSB::map_utf8z(CCharmapToLocalSB *this,char *dest,size_t dest_len,utf8_ptr src)

{
  uint *puVar1;
  uchar *puVar2;
  wchar_t wVar3;
  uint uVar4;
  ulong __n;
  size_t sVar5;
  bool bVar6;
  
  wVar3 = utf8_ptr::s_getch(src.p_);
  sVar5 = 0;
  while (wVar3 != L'\0') {
    wVar3 = utf8_ptr::s_getch(src.p_);
    puVar1 = (this->super_CCharmapToLocal).map_[(uint)wVar3 >> 8 & 0xff];
    if (puVar1 == (uint *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = puVar1[(uint)(wVar3 & 0xff)];
    }
    puVar2 = (this->super_CCharmapToLocal).xlat_array_;
    __n = (ulong)puVar2[uVar4];
    bVar6 = dest_len < __n;
    dest_len = dest_len - __n;
    if (bVar6) {
      dest_len = 0;
    }
    else {
      memcpy(dest,puVar2 + (ulong)uVar4 + 1,__n);
      dest = dest + __n;
    }
    sVar5 = sVar5 + __n;
    src.p_ = src.p_ + (ulong)((((byte)*src.p_ >> 5 & 1) != 0) + 1 & (uint)((byte)*src.p_ >> 7) * 3)
                      + 1;
    wVar3 = utf8_ptr::s_getch(src.p_);
  }
  if (dest_len != 0) {
    *dest = '\0';
  }
  return sVar5;
}

Assistant:

size_t CCharmapToLocalSB::map_utf8z(char *dest, size_t dest_len,
                                    utf8_ptr src) const
{
    size_t cur_total;

    /* copy characters until we find the terminating null */
    for (cur_total = 0 ; src.getch() != 0 ; src.inc())
    {
        const unsigned char *mapping;
        size_t map_len;

        /* get the mapping for this character */
        mapping = get_xlation(src.getch(), &map_len);

        /* 
         *   if we have room, add it; otherwise, zero the output length
         *   remaining so we don't try to add anything more 
         */
        if (map_len <= dest_len)
        {
            /* add the sequence */
            memcpy(dest, mapping, map_len);

            /* adjust the output pointer and length remaining */
            dest += map_len;
            dest_len -= map_len;
        }
        else
        {
            /* it doesn't fit - zero the output length remaining */
            dest_len = 0;
        }

        /* count the length in the total */
        cur_total += map_len;
    }

    /* 
     *   add a null terminator, if there's room, but don't count it in the
     *   output length 
     */
    if (dest_len > 0)
        *dest = '\0';
    
    /* return the total length of the result */
    return cur_total;
}